

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::UpdateEdgeIntoAEL(Clipper *this,TEdge **e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  clipperException *this_00;
  TEdge **ppTVar4;
  
  pTVar1 = *e;
  if (pTVar1->nextInLML == (TEdge *)0x0) {
    this_00 = (clipperException *)__cxa_allocate_exception(0x28);
    clipperException::clipperException(this_00,"UpdateEdgeIntoAEL: invalid call");
    __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
  }
  pTVar2 = pTVar1->prevInAEL;
  pTVar3 = pTVar1->nextInAEL;
  pTVar1->nextInLML->outIdx = pTVar1->outIdx;
  ppTVar4 = &pTVar2->nextInAEL;
  if (pTVar2 == (TEdge *)0x0) {
    ppTVar4 = &this->m_ActiveEdges;
  }
  *ppTVar4 = (*e)->nextInLML;
  if (pTVar3 != (TEdge *)0x0) {
    pTVar3->prevInAEL = (*e)->nextInLML;
  }
  (*e)->nextInLML->side = (*e)->side;
  (*e)->nextInLML->windDelta = (*e)->windDelta;
  (*e)->nextInLML->windCnt = (*e)->windCnt;
  (*e)->nextInLML->windCnt2 = (*e)->windCnt2;
  pTVar1 = (*e)->nextInLML;
  *e = pTVar1;
  pTVar1->prevInAEL = pTVar2;
  (*e)->nextInAEL = pTVar3;
  if (ABS((*e)->dx + 1e+40) < 1e-20) {
    return;
  }
  InsertScanbeam(this,(*e)->ytop);
  return;
}

Assistant:

void Clipper::UpdateEdgeIntoAEL(TEdge *&e)
{
  if( !e->nextInLML ) throw
    clipperException("UpdateEdgeIntoAEL: invalid call");
  TEdge* AelPrev = e->prevInAEL;
  TEdge* AelNext = e->nextInAEL;
  e->nextInLML->outIdx = e->outIdx;
  if( AelPrev ) AelPrev->nextInAEL = e->nextInLML;
  else m_ActiveEdges = e->nextInLML;
  if( AelNext ) AelNext->prevInAEL = e->nextInLML;
  e->nextInLML->side = e->side;
  e->nextInLML->windDelta = e->windDelta;
  e->nextInLML->windCnt = e->windCnt;
  e->nextInLML->windCnt2 = e->windCnt2;
  e = e->nextInLML;
  e->prevInAEL = AelPrev;
  e->nextInAEL = AelNext;
  if( !NEAR_EQUAL(e->dx, HORIZONTAL) ) InsertScanbeam( e->ytop );
}